

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::R32UIImageSingleValueVerifier::operator()
          (R32UIImageSingleValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int param_3)

{
  ostringstream *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  long *local_3e8;
  undefined8 local_3e0;
  long local_3d8;
  undefined8 uStack_3d0;
  ulong *local_3c8;
  long local_3c0;
  ulong local_3b8;
  long lStack_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  long *local_348 [2];
  long local_338 [2];
  ostringstream local_328 [112];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"// Note: expecting to get value ",0x20);
  dVar1 = this->m_min;
  dVar2 = this->m_max;
  if (dVar1 == dVar2) {
    std::__cxx11::ostringstream::ostringstream(local_328);
    std::ostream::_M_insert<unsigned_long>((ulong)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_328);
    std::ios_base::~ios_base(local_2b8);
    goto LAB_00459988;
  }
  std::__cxx11::ostringstream::ostringstream(local_328);
  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::ios_base::~ios_base(local_2b8);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x987961);
  local_368 = &local_358;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_358 = *plVar7;
    lStack_350 = plVar5[3];
  }
  else {
    local_358 = *plVar7;
    local_368 = (long *)*plVar5;
  }
  local_360 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_3b8 = *puVar8;
    lStack_3b0 = plVar5[3];
    local_3c8 = &local_3b8;
  }
  else {
    local_3b8 = *puVar8;
    local_3c8 = (ulong *)*plVar5;
  }
  local_3c0 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_328);
  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::ios_base::~ios_base(local_2b8);
  uVar9 = 0xf;
  if (local_3c8 != &local_3b8) {
    uVar9 = local_3b8;
  }
  if (uVar9 < (ulong)(local_380 + local_3c0)) {
    uVar9 = 0xf;
    if (local_388 != local_378) {
      uVar9 = local_378[0];
    }
    if (uVar9 < (ulong)(local_380 + local_3c0)) goto LAB_004598cc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3c8);
  }
  else {
LAB_004598cc:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_388);
  }
  local_3e8 = &local_3d8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_3d8 = *plVar5;
    uStack_3d0 = puVar6[3];
  }
  else {
    local_3d8 = *plVar5;
    local_3e8 = (long *)*puVar6;
  }
  local_3e0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  local_3a8 = &local_398;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_398 = *plVar7;
    lStack_390 = plVar5[3];
  }
  else {
    local_398 = *plVar7;
    local_3a8 = (long *)*plVar5;
  }
  local_3a0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
LAB_00459988:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),(char *)local_3a8,local_3a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,local_398 + 1);
  }
  if (dVar1 != dVar2) {
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_388 != local_378) {
      operator_delete(local_388,local_378[0] + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,local_3b8 + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,local_358 + 1);
    }
    if (local_348[0] != local_338) {
      operator_delete(local_348[0],local_338[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)local_1b0,(int)resultSlice,0,0)
  ;
  bVar3 = this->m_min <= (uint)local_1b0._0_4_;
  bVar4 = (uint)local_1b0._0_4_ <= this->m_max;
  this_00 = (ostringstream *)(local_1b0 + 8);
  if (bVar4 && bVar3) {
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// Success: got value ",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// Failure: got value ",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return bVar4 && bVar3;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int) const
	{
		DE_ASSERT(resultSlice.getWidth() == 1 && resultSlice.getHeight() == 1 && resultSlice.getDepth() == 1);
		DE_ASSERT(resultSlice.getFormat() == TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32));

		log << TestLog::Message << "// Note: expecting to get value " << (m_min == m_max ? toString(m_min) : "in range [" + toString(m_min) + ", " + toString(m_max) + "]") << TestLog::EndMessage;

		const deUint32 resultValue = resultSlice.getPixelUint(0, 0).x();
		if (!de::inRange(resultValue, m_min, m_max))
		{
			log << TestLog::Message << "// Failure: got value " << resultValue << TestLog::EndMessage;
			return false;
		}
		else
		{
			log << TestLog::Message << "// Success: got value " << resultValue << TestLog::EndMessage;
			return true;
		}
	}